

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::FeatureVectorizer_InputColumn::SerializeWithCachedSizes
          (FeatureVectorizer_InputColumn *this,CodedOutputStream *output)

{
  int size;
  long lVar1;
  char *data;
  string *value;
  uint64 uVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  FeatureVectorizer_InputColumn *this_local;
  
  inputcolumn_abi_cxx11_(this);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    inputcolumn_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    inputcolumn_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,size,SERIALIZE,"CoreML.Specification.FeatureVectorizer.InputColumn.inputColumn")
    ;
    value = inputcolumn_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,value,output);
  }
  uVar2 = inputdimensions(this);
  if (uVar2 != 0) {
    uVar2 = inputdimensions(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,uVar2,output);
  }
  return;
}

Assistant:

void FeatureVectorizer_InputColumn::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.FeatureVectorizer.InputColumn)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // string inputColumn = 1;
  if (this->inputcolumn().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->inputcolumn().data(), this->inputcolumn().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.FeatureVectorizer.InputColumn.inputColumn");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->inputcolumn(), output);
  }

  // uint64 inputDimensions = 2;
  if (this->inputdimensions() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->inputdimensions(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.FeatureVectorizer.InputColumn)
}